

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O2

void __thiscall
dlib::fc_<1000UL,_(dlib::fc_bias_mode)0>::fc_
          (fc_<1000UL,_(dlib::fc_bias_mode)0> *this,num_fc_outputs o)

{
  this->num_outputs = o.num_outputs;
  this->num_inputs = 0;
  resizable_tensor::resizable_tensor(&this->params);
  (this->weights).inst.super_tensor.m_size = 0;
  (this->weights).inst.super_tensor.m_n = 0;
  (this->weights).inst.super_tensor.m_k = 0;
  (this->weights).inst.super_tensor.m_nr = 0;
  (this->weights).inst.super_tensor.m_nc = 0;
  (this->weights).inst.super_tensor._vptr_tensor = (_func_int **)&PTR__tensor_001fa488;
  (this->weights).inst.data_instance = (gpu_data *)0x0;
  (this->weights).inst._annotation = (any *)0x0;
  (this->weights).inst.data_offset = 0;
  (this->biases).inst.super_tensor.m_n = 0;
  (this->biases).inst.super_tensor.m_k = 0;
  (this->biases).inst.super_tensor.m_nr = 0;
  (this->biases).inst.super_tensor.m_nc = 0;
  (this->biases).inst.super_tensor.m_size = 0;
  (this->biases).inst.super_tensor._vptr_tensor = (_func_int **)&PTR__tensor_001fa488;
  (this->biases).inst.data_instance = (gpu_data *)0x0;
  (this->biases).inst._annotation = (any *)0x0;
  (this->biases).inst.data_offset = 0;
  this->learning_rate_multiplier = 1.0;
  this->weight_decay_multiplier = 1.0;
  this->bias_learning_rate_multiplier = 1.0;
  this->bias_weight_decay_multiplier = 0.0;
  this->use_bias = true;
  return;
}

Assistant:

fc_(num_fc_outputs o) : num_outputs(o.num_outputs), num_inputs(0),
            learning_rate_multiplier(1),
            weight_decay_multiplier(1),
            bias_learning_rate_multiplier(1),
            bias_weight_decay_multiplier(0),
            use_bias(true)
        {}